

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_4x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined4 uVar2;
  uint3 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar35;
  ulong uVar36;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  undefined4 *puVar37;
  ushort uVar39;
  undefined1 auVar38 [16];
  int val_16;
  int val_11;
  int val_6;
  int val_1;
  int val;
  __m128i tmp_4;
  __m128i tmp_3;
  __m128i tmp_2;
  __m128i tmp_1;
  __m128i tmp;
  __m128i cvtepi32_epi8_15;
  __m128i pred_15;
  __m128i pred_sum_15;
  __m128i weighted_left_y_15;
  __m128i cvtepi32_epi8_14;
  __m128i pred_14;
  __m128i pred_sum_14;
  __m128i weighted_left_y_14;
  __m128i cvtepi32_epi8_13;
  __m128i pred_13;
  __m128i pred_sum_13;
  __m128i weighted_left_y_13;
  __m128i cvtepi32_epi8_12;
  __m128i pred_12;
  __m128i pred_sum_12;
  __m128i weighted_left_y_12;
  __m128i cvtepi32_epi8_11;
  __m128i pred_11;
  __m128i pred_sum_11;
  __m128i weighted_left_y_11;
  __m128i cvtepi32_epi8_10;
  __m128i pred_10;
  __m128i pred_sum_10;
  __m128i weighted_left_y_10;
  __m128i cvtepi32_epi8_9;
  __m128i pred_9;
  __m128i pred_sum_9;
  __m128i weighted_left_y_9;
  __m128i cvtepi32_epi8_8;
  __m128i pred_8;
  __m128i pred_sum_8;
  __m128i weighted_left_y_8;
  __m128i cvtepi32_epi8_7;
  __m128i pred_7;
  __m128i pred_sum_7;
  __m128i weighted_left_y_7;
  __m128i cvtepi32_epi8_6;
  __m128i pred_6;
  __m128i pred_sum_6;
  __m128i weighted_left_y_6;
  __m128i cvtepi32_epi8_5;
  __m128i pred_5;
  __m128i pred_sum_5;
  __m128i weighted_left_y_5;
  __m128i cvtepi32_epi8_4;
  __m128i pred_4;
  __m128i pred_sum_4;
  __m128i weighted_left_y_4;
  __m128i cvtepi32_epi8_3;
  __m128i pred_3;
  __m128i pred_sum_3;
  __m128i weighted_left_y_3;
  __m128i cvtepi32_epi8_2;
  __m128i pred_2;
  __m128i pred_sum_2;
  __m128i weighted_left_y_2;
  __m128i cvtepi32_epi8_1;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i weighted_left_y_1;
  __m128i cvtepi32_epi8;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_left_y;
  int val_2;
  int val_3;
  int val_4;
  int val_5;
  int val_7;
  int val_8;
  int val_9;
  int val_10;
  int val_12;
  int val_13;
  int val_14;
  int val_15;
  int val_17;
  int val_18;
  int val_19;
  int val_20;
  ushort local_1c38;
  ushort uStack_1c34;
  ushort uStack_1c2c;
  byte local_1bb8;
  byte bStack_1bb7;
  byte bStack_1bb6;
  byte bStack_1bb5;
  byte local_1b58;
  byte bStack_1b57;
  byte bStack_1b56;
  byte bStack_1b55;
  byte local_1af8;
  byte bStack_1af7;
  byte bStack_1af6;
  byte bStack_1af5;
  byte local_1a98;
  byte bStack_1a97;
  byte bStack_1a96;
  byte bStack_1a95;
  ushort local_1968;
  ushort uStack_1964;
  ushort uStack_195c;
  ushort local_18a8;
  ushort uStack_18a4;
  ushort uStack_189c;
  ushort local_17e8;
  ushort uStack_17e4;
  ushort uStack_17dc;
  short local_1728;
  short sStack_1724;
  short sStack_1720;
  short sStack_171c;
  ushort local_1668;
  ushort uStack_1664;
  ushort uStack_165c;
  ushort local_15a8;
  ushort uStack_15a4;
  ushort uStack_159c;
  ushort local_14e8;
  ushort uStack_14e4;
  ushort uStack_14dc;
  short local_1428;
  short sStack_1424;
  short sStack_1420;
  short sStack_141c;
  ushort local_1368;
  ushort uStack_1364;
  ushort uStack_135c;
  ushort local_12a8;
  ushort uStack_12a4;
  ushort uStack_129c;
  ushort local_11e8;
  ushort uStack_11e4;
  ushort uStack_11dc;
  short local_1128;
  short sStack_1124;
  short sStack_1120;
  short sStack_111c;
  ushort local_1068;
  ushort uStack_1064;
  ushort uStack_105c;
  ushort local_fa8;
  ushort uStack_fa4;
  ushort uStack_f9c;
  ushort local_ee8;
  ushort uStack_ee4;
  ushort uStack_edc;
  short local_e28;
  short sStack_e24;
  short sStack_e20;
  short sStack_e1c;
  uint uStack_d04;
  uint uStack_cfc;
  uint uStack_cf4;
  uint uStack_cec;
  uint uStack_cc4;
  uint uStack_cbc;
  uint uStack_cb4;
  uint uStack_cac;
  uint uStack_c84;
  uint uStack_c7c;
  uint uStack_c74;
  uint uStack_c6c;
  uint uStack_c44;
  uint uStack_c3c;
  uint uStack_c34;
  uint uStack_c2c;
  uint uStack_c04;
  uint uStack_bfc;
  uint uStack_bf4;
  uint uStack_bec;
  uint uStack_bc4;
  uint uStack_bbc;
  uint uStack_bb4;
  uint uStack_bac;
  uint uStack_b84;
  uint uStack_b7c;
  uint uStack_b74;
  uint uStack_b6c;
  uint uStack_b44;
  uint uStack_b3c;
  uint uStack_b34;
  uint uStack_b2c;
  uint uStack_b04;
  uint uStack_afc;
  uint uStack_af4;
  uint uStack_aec;
  uint uStack_ac4;
  uint uStack_abc;
  uint uStack_ab4;
  uint uStack_aac;
  uint uStack_a84;
  uint uStack_a7c;
  uint uStack_a74;
  uint uStack_a6c;
  uint uStack_a44;
  uint uStack_a3c;
  uint uStack_a34;
  uint uStack_a2c;
  uint uStack_a04;
  uint uStack_9fc;
  uint uStack_9f4;
  uint uStack_9ec;
  uint uStack_9c4;
  uint uStack_9bc;
  uint uStack_9b4;
  uint uStack_9ac;
  uint uStack_984;
  uint uStack_97c;
  uint uStack_974;
  uint uStack_96c;
  uint uStack_944;
  uint uStack_93c;
  uint uStack_934;
  uint uStack_92c;
  undefined4 local_4d8;
  undefined4 local_488;
  undefined4 local_438;
  undefined4 local_3e8;
  undefined4 local_398;
  undefined4 local_348;
  undefined4 local_2f8;
  undefined4 local_2a8;
  undefined4 local_258;
  undefined4 local_208;
  undefined4 local_1b8;
  undefined4 local_168;
  undefined4 local_118;
  undefined4 local_c8;
  __m128i left_y;
  __m128i left;
  __m128i round;
  __m128i scaled_top_right;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i top_right;
  
  bVar1 = *(byte *)(in_RDX + 3);
  local_1c38 = (ushort)bVar1;
  uStack_1c34 = (ushort)bVar1;
  uStack_1c2c = (ushort)bVar1;
  uStack_1c34 = uStack_1c34 * 0x6b;
  uVar39 = local_1c38 * 0xab;
  uStack_1c2c = uStack_1c2c * 0xc0;
  uVar2 = *in_RCX;
  local_1a98 = (byte)uVar2;
  bStack_1a97 = (byte)((uint)uVar2 >> 8);
  bStack_1a96 = (byte)((uint)uVar2 >> 0x10);
  bStack_1a95 = (byte)((uint)uVar2 >> 0x18);
  uVar3 = CONCAT12(bStack_1a97,(ushort)local_1a98);
  uVar35 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  uVar36 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  local_e28 = (short)uVar35;
  sStack_e24 = (short)(uVar35 >> 0x20);
  sStack_e20 = (short)uVar36;
  sStack_e1c = (short)(uVar36 >> 0x20);
  uStack_cf4 = (uint)uStack_1c34;
  uStack_cec = (uint)uStack_1c2c;
  uStack_d04 = (uint)(ushort)(sStack_e24 * 0x95);
  uStack_cfc = (uint)(ushort)(sStack_e1c * 0x40);
  auVar34._4_4_ = uStack_cf4 + uStack_d04 + 0x800080 >> 8;
  auVar34._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_e28 * 0xff) + 0x800080 >> 8;
  auVar34._12_4_ = uStack_cec + uStack_cfc + 0x800080 >> 8;
  auVar34._8_4_ = (uint)uVar39 + (uint)(ushort)(sStack_e20 * 0x55) + 0x800080 >> 8;
  auVar33._8_8_ = 0xc0804000c080400;
  auVar33._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar34,auVar33);
  local_4d8 = auVar38._0_4_;
  *in_RDI = local_4d8;
  local_ee8 = (ushort)bStack_1a97;
  uStack_ee4 = (ushort)bStack_1a97;
  uStack_edc = (ushort)bStack_1a97;
  uStack_cb4 = (uint)uStack_1c34;
  uStack_cac = (uint)uStack_1c2c;
  uStack_cc4 = (uint)(ushort)(uStack_ee4 * 0x95);
  uStack_cbc = (uint)(ushort)(uStack_edc * 0x40);
  auVar32._4_4_ = uStack_cb4 + uStack_cc4 + 0x800080 >> 8;
  auVar32._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_ee8 * 0xff) + 0x800080 >> 8;
  auVar32._12_4_ = uStack_cac + uStack_cbc + 0x800080 >> 8;
  auVar32._8_4_ = (uint)uVar39 + (uint)(ushort)(local_ee8 * 0x55) + 0x800080 >> 8;
  auVar31._8_8_ = 0xc0804000c080400;
  auVar31._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar32,auVar31);
  local_488 = auVar38._0_4_;
  *(undefined4 *)((long)in_RDI + in_RSI) = local_488;
  puVar37 = (undefined4 *)((long)in_RDI + in_RSI + in_RSI);
  local_fa8 = (ushort)bStack_1a96;
  uStack_fa4 = (ushort)bStack_1a96;
  uStack_f9c = (ushort)bStack_1a96;
  uStack_c74 = (uint)uStack_1c34;
  uStack_c6c = (uint)uStack_1c2c;
  uStack_c84 = (uint)(ushort)(uStack_fa4 * 0x95);
  uStack_c7c = (uint)(ushort)(uStack_f9c * 0x40);
  auVar30._4_4_ = uStack_c74 + uStack_c84 + 0x800080 >> 8;
  auVar30._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_fa8 * 0xff) + 0x800080 >> 8;
  auVar30._12_4_ = uStack_c6c + uStack_c7c + 0x800080 >> 8;
  auVar30._8_4_ = (uint)uVar39 + (uint)(ushort)(local_fa8 * 0x55) + 0x800080 >> 8;
  auVar29._8_8_ = 0xc0804000c080400;
  auVar29._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar30,auVar29);
  local_438 = auVar38._0_4_;
  *puVar37 = local_438;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_1068 = (ushort)bStack_1a95;
  uStack_1064 = (ushort)bStack_1a95;
  uStack_105c = (ushort)bStack_1a95;
  uStack_c34 = (uint)uStack_1c34;
  uStack_c2c = (uint)uStack_1c2c;
  uStack_c44 = (uint)(ushort)(uStack_1064 * 0x95);
  uStack_c3c = (uint)(ushort)(uStack_105c * 0x40);
  auVar28._4_4_ = uStack_c34 + uStack_c44 + 0x800080 >> 8;
  auVar28._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_1068 * 0xff) + 0x800080 >> 8;
  auVar28._12_4_ = uStack_c2c + uStack_c3c + 0x800080 >> 8;
  auVar28._8_4_ = (uint)uVar39 + (uint)(ushort)(local_1068 * 0x55) + 0x800080 >> 8;
  auVar27._8_8_ = 0xc0804000c080400;
  auVar27._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar28,auVar27);
  local_3e8 = auVar38._0_4_;
  *puVar37 = local_3e8;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  uVar2 = in_RCX[1];
  local_1af8 = (byte)uVar2;
  bStack_1af7 = (byte)((uint)uVar2 >> 8);
  bStack_1af6 = (byte)((uint)uVar2 >> 0x10);
  bStack_1af5 = (byte)((uint)uVar2 >> 0x18);
  uVar3 = CONCAT12(bStack_1af7,(ushort)local_1af8);
  uVar35 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  uVar36 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  local_1128 = (short)uVar35;
  sStack_1124 = (short)(uVar35 >> 0x20);
  sStack_1120 = (short)uVar36;
  sStack_111c = (short)(uVar36 >> 0x20);
  uStack_bf4 = (uint)uStack_1c34;
  uStack_bec = (uint)uStack_1c2c;
  uStack_c04 = (uint)(ushort)(sStack_1124 * 0x95);
  uStack_bfc = (uint)(ushort)(sStack_111c * 0x40);
  auVar26._4_4_ = uStack_bf4 + uStack_c04 + 0x800080 >> 8;
  auVar26._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_1128 * 0xff) + 0x800080 >> 8;
  auVar26._12_4_ = uStack_bec + uStack_bfc + 0x800080 >> 8;
  auVar26._8_4_ = (uint)uVar39 + (uint)(ushort)(sStack_1120 * 0x55) + 0x800080 >> 8;
  auVar25._8_8_ = 0xc0804000c080400;
  auVar25._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar26,auVar25);
  local_398 = auVar38._0_4_;
  *puVar37 = local_398;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_11e8 = (ushort)bStack_1af7;
  uStack_11e4 = (ushort)bStack_1af7;
  uStack_11dc = (ushort)bStack_1af7;
  uStack_bb4 = (uint)uStack_1c34;
  uStack_bac = (uint)uStack_1c2c;
  uStack_bc4 = (uint)(ushort)(uStack_11e4 * 0x95);
  uStack_bbc = (uint)(ushort)(uStack_11dc * 0x40);
  auVar24._4_4_ = uStack_bb4 + uStack_bc4 + 0x800080 >> 8;
  auVar24._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_11e8 * 0xff) + 0x800080 >> 8;
  auVar24._12_4_ = uStack_bac + uStack_bbc + 0x800080 >> 8;
  auVar24._8_4_ = (uint)uVar39 + (uint)(ushort)(local_11e8 * 0x55) + 0x800080 >> 8;
  auVar23._8_8_ = 0xc0804000c080400;
  auVar23._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar24,auVar23);
  local_348 = auVar38._0_4_;
  *puVar37 = local_348;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_12a8 = (ushort)bStack_1af6;
  uStack_12a4 = (ushort)bStack_1af6;
  uStack_129c = (ushort)bStack_1af6;
  uStack_b74 = (uint)uStack_1c34;
  uStack_b6c = (uint)uStack_1c2c;
  uStack_b84 = (uint)(ushort)(uStack_12a4 * 0x95);
  uStack_b7c = (uint)(ushort)(uStack_129c * 0x40);
  auVar22._4_4_ = uStack_b74 + uStack_b84 + 0x800080 >> 8;
  auVar22._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_12a8 * 0xff) + 0x800080 >> 8;
  auVar22._12_4_ = uStack_b6c + uStack_b7c + 0x800080 >> 8;
  auVar22._8_4_ = (uint)uVar39 + (uint)(ushort)(local_12a8 * 0x55) + 0x800080 >> 8;
  auVar21._8_8_ = 0xc0804000c080400;
  auVar21._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar22,auVar21);
  local_2f8 = auVar38._0_4_;
  *puVar37 = local_2f8;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_1368 = (ushort)bStack_1af5;
  uStack_1364 = (ushort)bStack_1af5;
  uStack_135c = (ushort)bStack_1af5;
  uStack_b34 = (uint)uStack_1c34;
  uStack_b2c = (uint)uStack_1c2c;
  uStack_b44 = (uint)(ushort)(uStack_1364 * 0x95);
  uStack_b3c = (uint)(ushort)(uStack_135c * 0x40);
  auVar20._4_4_ = uStack_b34 + uStack_b44 + 0x800080 >> 8;
  auVar20._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_1368 * 0xff) + 0x800080 >> 8;
  auVar20._12_4_ = uStack_b2c + uStack_b3c + 0x800080 >> 8;
  auVar20._8_4_ = (uint)uVar39 + (uint)(ushort)(local_1368 * 0x55) + 0x800080 >> 8;
  auVar19._8_8_ = 0xc0804000c080400;
  auVar19._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar20,auVar19);
  local_2a8 = auVar38._0_4_;
  *puVar37 = local_2a8;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  uVar2 = in_RCX[2];
  local_1b58 = (byte)uVar2;
  bStack_1b57 = (byte)((uint)uVar2 >> 8);
  bStack_1b56 = (byte)((uint)uVar2 >> 0x10);
  bStack_1b55 = (byte)((uint)uVar2 >> 0x18);
  uVar3 = CONCAT12(bStack_1b57,(ushort)local_1b58);
  uVar35 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  uVar36 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  local_1428 = (short)uVar35;
  sStack_1424 = (short)(uVar35 >> 0x20);
  sStack_1420 = (short)uVar36;
  sStack_141c = (short)(uVar36 >> 0x20);
  uStack_af4 = (uint)uStack_1c34;
  uStack_aec = (uint)uStack_1c2c;
  uStack_b04 = (uint)(ushort)(sStack_1424 * 0x95);
  uStack_afc = (uint)(ushort)(sStack_141c * 0x40);
  auVar18._4_4_ = uStack_af4 + uStack_b04 + 0x800080 >> 8;
  auVar18._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_1428 * 0xff) + 0x800080 >> 8;
  auVar18._12_4_ = uStack_aec + uStack_afc + 0x800080 >> 8;
  auVar18._8_4_ = (uint)uVar39 + (uint)(ushort)(sStack_1420 * 0x55) + 0x800080 >> 8;
  auVar17._8_8_ = 0xc0804000c080400;
  auVar17._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar18,auVar17);
  local_258 = auVar38._0_4_;
  *puVar37 = local_258;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_14e8 = (ushort)bStack_1b57;
  uStack_14e4 = (ushort)bStack_1b57;
  uStack_14dc = (ushort)bStack_1b57;
  uStack_ab4 = (uint)uStack_1c34;
  uStack_aac = (uint)uStack_1c2c;
  uStack_ac4 = (uint)(ushort)(uStack_14e4 * 0x95);
  uStack_abc = (uint)(ushort)(uStack_14dc * 0x40);
  auVar16._4_4_ = uStack_ab4 + uStack_ac4 + 0x800080 >> 8;
  auVar16._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_14e8 * 0xff) + 0x800080 >> 8;
  auVar16._12_4_ = uStack_aac + uStack_abc + 0x800080 >> 8;
  auVar16._8_4_ = (uint)uVar39 + (uint)(ushort)(local_14e8 * 0x55) + 0x800080 >> 8;
  auVar15._8_8_ = 0xc0804000c080400;
  auVar15._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar16,auVar15);
  local_208 = auVar38._0_4_;
  *puVar37 = local_208;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_15a8 = (ushort)bStack_1b56;
  uStack_15a4 = (ushort)bStack_1b56;
  uStack_159c = (ushort)bStack_1b56;
  uStack_a74 = (uint)uStack_1c34;
  uStack_a6c = (uint)uStack_1c2c;
  uStack_a84 = (uint)(ushort)(uStack_15a4 * 0x95);
  uStack_a7c = (uint)(ushort)(uStack_159c * 0x40);
  auVar14._4_4_ = uStack_a74 + uStack_a84 + 0x800080 >> 8;
  auVar14._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_15a8 * 0xff) + 0x800080 >> 8;
  auVar14._12_4_ = uStack_a6c + uStack_a7c + 0x800080 >> 8;
  auVar14._8_4_ = (uint)uVar39 + (uint)(ushort)(local_15a8 * 0x55) + 0x800080 >> 8;
  auVar13._8_8_ = 0xc0804000c080400;
  auVar13._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar14,auVar13);
  local_1b8 = auVar38._0_4_;
  *puVar37 = local_1b8;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_1668 = (ushort)bStack_1b55;
  uStack_1664 = (ushort)bStack_1b55;
  uStack_165c = (ushort)bStack_1b55;
  uStack_a34 = (uint)uStack_1c34;
  uStack_a2c = (uint)uStack_1c2c;
  uStack_a44 = (uint)(ushort)(uStack_1664 * 0x95);
  uStack_a3c = (uint)(ushort)(uStack_165c * 0x40);
  auVar12._4_4_ = uStack_a34 + uStack_a44 + 0x800080 >> 8;
  auVar12._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_1668 * 0xff) + 0x800080 >> 8;
  auVar12._12_4_ = uStack_a2c + uStack_a3c + 0x800080 >> 8;
  auVar12._8_4_ = (uint)uVar39 + (uint)(ushort)(local_1668 * 0x55) + 0x800080 >> 8;
  auVar11._8_8_ = 0xc0804000c080400;
  auVar11._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar12,auVar11);
  local_168 = auVar38._0_4_;
  *puVar37 = local_168;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  uVar2 = in_RCX[3];
  local_1bb8 = (byte)uVar2;
  bStack_1bb7 = (byte)((uint)uVar2 >> 8);
  bStack_1bb6 = (byte)((uint)uVar2 >> 0x10);
  bStack_1bb5 = (byte)((uint)uVar2 >> 0x18);
  uVar3 = CONCAT12(bStack_1bb7,(ushort)local_1bb8);
  uVar35 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  uVar36 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  local_1728 = (short)uVar35;
  sStack_1724 = (short)(uVar35 >> 0x20);
  sStack_1720 = (short)uVar36;
  sStack_171c = (short)(uVar36 >> 0x20);
  uStack_9f4 = (uint)uStack_1c34;
  uStack_9ec = (uint)uStack_1c2c;
  uStack_a04 = (uint)(ushort)(sStack_1724 * 0x95);
  uStack_9fc = (uint)(ushort)(sStack_171c * 0x40);
  auVar10._4_4_ = uStack_9f4 + uStack_a04 + 0x800080 >> 8;
  auVar10._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_1728 * 0xff) + 0x800080 >> 8;
  auVar10._12_4_ = uStack_9ec + uStack_9fc + 0x800080 >> 8;
  auVar10._8_4_ = (uint)uVar39 + (uint)(ushort)(sStack_1720 * 0x55) + 0x800080 >> 8;
  auVar9._8_8_ = 0xc0804000c080400;
  auVar9._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar10,auVar9);
  local_118 = auVar38._0_4_;
  *puVar37 = local_118;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_17e8 = (ushort)bStack_1bb7;
  uStack_17e4 = (ushort)bStack_1bb7;
  uStack_17dc = (ushort)bStack_1bb7;
  uStack_9b4 = (uint)uStack_1c34;
  uStack_9ac = (uint)uStack_1c2c;
  uStack_9c4 = (uint)(ushort)(uStack_17e4 * 0x95);
  uStack_9bc = (uint)(ushort)(uStack_17dc * 0x40);
  auVar8._4_4_ = uStack_9b4 + uStack_9c4 + 0x800080 >> 8;
  auVar8._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_17e8 * 0xff) + 0x800080 >> 8;
  auVar8._12_4_ = uStack_9ac + uStack_9bc + 0x800080 >> 8;
  auVar8._8_4_ = (uint)uVar39 + (uint)(ushort)(local_17e8 * 0x55) + 0x800080 >> 8;
  auVar7._8_8_ = 0xc0804000c080400;
  auVar7._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar8,auVar7);
  local_c8 = auVar38._0_4_;
  *puVar37 = local_c8;
  puVar37 = (undefined4 *)((long)puVar37 + in_RSI);
  local_18a8 = (ushort)bStack_1bb6;
  uStack_18a4 = (ushort)bStack_1bb6;
  uStack_189c = (ushort)bStack_1bb6;
  uStack_974 = (uint)uStack_1c34;
  uStack_96c = (uint)uStack_1c2c;
  uStack_984 = (uint)(ushort)(uStack_18a4 * 0x95);
  uStack_97c = (uint)(ushort)(uStack_189c * 0x40);
  auVar6._4_4_ = uStack_974 + uStack_984 + 0x800080 >> 8;
  auVar6._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_18a8 * 0xff) + 0x800080 >> 8;
  auVar6._12_4_ = uStack_96c + uStack_97c + 0x800080 >> 8;
  auVar6._8_4_ = (uint)uVar39 + (uint)(ushort)(local_18a8 * 0x55) + 0x800080 >> 8;
  auVar5._8_8_ = 0xc0804000c080400;
  auVar5._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar6,auVar5);
  left_y[1]._0_4_ = auVar38._0_4_;
  *puVar37 = (undefined4)left_y[1];
  local_1968 = (ushort)bStack_1bb5;
  uStack_1964 = (ushort)bStack_1bb5;
  uStack_195c = (ushort)bStack_1bb5;
  uStack_934 = (uint)uStack_1c34;
  uStack_92c = (uint)uStack_1c2c;
  uStack_944 = (uint)(ushort)(uStack_1964 * 0x95);
  uStack_93c = (uint)(ushort)(uStack_195c * 0x40);
  auVar4._4_4_ = uStack_934 + uStack_944 + 0x800080 >> 8;
  auVar4._0_4_ = (uint)local_1c38 + (uint)(ushort)(local_1968 * 0xff) + 0x800080 >> 8;
  auVar4._12_4_ = uStack_92c + uStack_93c + 0x800080 >> 8;
  auVar4._8_4_ = (uint)uVar39 + (uint)(ushort)(local_1968 * 0x55) + 0x800080 >> 8;
  auVar38._8_8_ = 0xc0804000c080400;
  auVar38._0_8_ = 0xc0804000c080400;
  auVar38 = pshufb(auVar4,auVar38);
  scale[1]._0_4_ = auVar38._0_4_;
  *(undefined4 *)((long)puVar37 + in_RSI) = (undefined4)scale[1];
  return;
}

Assistant:

void aom_smooth_h_predictor_4x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi32(top_row[3]);
  const __m128i weights = cvtepu8_epi32(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi32(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi32(Load4(left_column));
  __m128i left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;

  left = cvtepu8_epi32(Load4(left_column + 4));
  left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;

  left = cvtepu8_epi32(Load4(left_column + 8));
  left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;

  left = cvtepu8_epi32(Load4(left_column + 12));
  left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
}